

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniformField.cpp
# Opt level: O2

void __thiscall OpenMD::UniformField::UniformField(UniformField *this,SimInfo *info)

{
  (this->super_ForceModifier).info_ = info;
  (this->super_ForceModifier)._vptr_ForceModifier = (_func_int **)&PTR__ForceModifier_002bbab8;
  this->initialized = false;
  this->doUniformField = false;
  this->doParticlePot = false;
  Vector<double,_3U>::Vector(&(this->EF).super_Vector<double,_3U>);
  this->simParams = ((this->super_ForceModifier).info_)->simParams_;
  return;
}

Assistant:

UniformField::UniformField(SimInfo* info) :
      ForceModifier {info}, initialized {false}, doUniformField {false},
      doParticlePot {false} {
    simParams = info_->getSimParams();
  }